

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.h
# Opt level: O3

Vector3 FBX::getProperty(Node *node,string *property,Vector3 *fallback)

{
  double dVar1;
  double dVar2;
  pointer pcVar3;
  size_t __n;
  undefined8 uVar4;
  int iVar5;
  variant_alternative_t<6UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar6;
  variant_alternative_t<4UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar7;
  pointer pNVar8;
  float fVar9;
  Vector3 VVar10;
  Node properties;
  string local_d0;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_b0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  long *local_88 [2];
  long local_78 [2];
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_68;
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  local_50;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Properties70","");
  findNodes(&local_b0,
            (FBX *)(node->children).super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>.
                   _M_impl.super__Vector_impl_data._M_start,
            (node->children).super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
            super__Vector_impl_data._M_finish,&local_d0);
  local_98 = (undefined4)
             (local_b0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
              super__Vector_impl_data._M_start)->propertyCount;
  uStack_94 = *(undefined4 *)
               ((long)&(local_b0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                        super__Vector_impl_data._M_start)->propertyCount + 4);
  uStack_90 = (undefined4)
              (local_b0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
               super__Vector_impl_data._M_start)->propertyLength;
  uStack_8c = *(undefined4 *)
               ((long)&(local_b0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                        super__Vector_impl_data._M_start)->propertyLength + 4);
  local_88[0] = local_78;
  pcVar3 = ((local_b0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start)->id)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar3,
             pcVar3 + ((local_b0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                        super__Vector_impl_data._M_start)->id)._M_string_length);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::vector
            (&local_68,
             &(local_b0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
               super__Vector_impl_data._M_start)->children);
  std::
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::vector(&local_50,
           &(local_b0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start)->properties);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_b0);
  pNVar8 = local_68.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    pNVar8 = local_68.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  do {
    if (pNVar8 == local_68.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      uVar4._0_4_ = fallback->x;
      uVar4._4_4_ = fallback->y;
      fVar9 = fallback->z;
LAB_0010a3c0:
      std::
      vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
      ::~vector(&local_50);
      std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_68);
      if (local_88[0] != local_78) {
        operator_delete(local_88[0],local_78[0] + 1);
      }
      VVar10.z = fVar9;
      VVar10.x = (float)(int)uVar4;
      VVar10.y = (float)(int)((ulong)uVar4 >> 0x20);
      return VVar10;
    }
    pvVar6 = std::
             get<6ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       ((pNVar8->properties).
                        super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    __n = pvVar6->_M_string_length;
    if ((__n == property->_M_string_length) &&
       ((__n == 0 ||
        (iVar5 = bcmp((pvVar6->_M_dataplus)._M_p,(property->_M_dataplus)._M_p,__n), iVar5 == 0)))) {
      pvVar7 = std::
               get<4ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                         ((pNVar8->properties).
                          super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
      dVar1 = *pvVar7;
      pvVar7 = std::
               get<4ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                         ((pNVar8->properties).
                          super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 5);
      dVar2 = *pvVar7;
      pvVar7 = std::
               get<4ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                         ((pNVar8->properties).
                          super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 6);
      uVar4 = CONCAT44((float)dVar2,(float)dVar1);
      fVar9 = (float)*pvVar7;
      goto LAB_0010a3c0;
    }
    pNVar8 = pNVar8 + 1;
  } while( true );
}

Assistant:

static Vector3 getProperty(const Node &node, const std::string &property, const Vector3 &fallback) {
        const Node properties = findNodes(node, "Properties70")[0];

        for (const auto &prop : properties.children)
            if (std::get<std::string>(prop.properties[0]) == property)
                return {
                        static_cast<float>(std::get<double>(prop.properties[4])),
                        static_cast<float>(std::get<double>(prop.properties[5])),
                        static_cast<float>(std::get<double>(prop.properties[6]))
                };
        return fallback;
    }